

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O0

void Zyx_ManExactSynthesis(Bmc_EsPar_t *pPars)

{
  int iVar1;
  abctime aVar2;
  Zyx_Man_t *p_00;
  abctime aVar3;
  char *pcVar4;
  bool bVar5;
  word *local_e8;
  ulong uStack_c8;
  int nLazy;
  word pTruth [16];
  Zyx_Man_t *p;
  abctime clk;
  abctime clkTotal;
  int nSols;
  int nLazyAll;
  int fCompl;
  int iMint;
  int Iter;
  int status;
  Bmc_EsPar_t *pPars_local;
  
  nLazyAll = 0;
  nSols = 0;
  clkTotal._4_4_ = 0;
  clkTotal._0_4_ = 0;
  aVar2 = Abc_Clock();
  p = (Zyx_Man_t *)Abc_Clock();
  if (pPars->fMajority == 0) {
    Abc_TtReadHex(&stack0xffffffffffffff38,pPars->pTtStr);
    bVar5 = (uStack_c8 & 1) != 0;
    if (bVar5) {
      iVar1 = Abc_TtWordNum(pPars->nVars);
      Abc_TtNot(&stack0xffffffffffffff38,iVar1);
    }
    nSols = (int)bVar5;
  }
  if (10 < pPars->nVars) {
    __assert_fail("pPars->nVars <= 10",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                  ,0x4f8,"void Zyx_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  if (6 < pPars->nLutSize) {
    __assert_fail("pPars->nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj3.c"
                  ,0x4f9,"void Zyx_ManExactSynthesis(Bmc_EsPar_t *)");
  }
  if (pPars->fMajority == 0) {
    local_e8 = &stack0xffffffffffffff38;
  }
  else {
    local_e8 = (word *)0x0;
  }
  p_00 = Zyx_ManAlloc(pPars,local_e8);
  pcVar4 = "LUTs";
  if (p_00->pPars->fMajority != 0) {
    pcVar4 = "MAJ-gates";
  }
  printf("Running exact synthesis for %d-input function with %d %d-input %s...\n",
         (ulong)(uint)p_00->pPars->nVars,(ulong)(uint)p_00->pPars->nNodes,
         (ulong)(uint)p_00->pPars->nLutSize,pcVar4);
  fCompl = 0;
  do {
    while (iMint = bmcg_sat_solver_solve(p_00->pSat,(int *)0x0,0), iMint == 1) {
      iVar1 = Zyx_ManAddCnfLazyTopo(p_00);
      if (iVar1 == -1) {
        printf("Became UNSAT after adding lazy constraints.\n");
        iMint = -1;
        break;
      }
      if (iVar1 == 0) break;
      clkTotal._4_4_ = iVar1 + clkTotal._4_4_;
    }
    if (iMint == -1) goto LAB_0071523f;
    nLazyAll = Zyx_ManEval(p_00);
    if (nLazyAll == 0xffffffff) {
      if (pPars->fEnumSols == 0) goto LAB_0071523f;
      clkTotal._0_4_ = (uint)clkTotal + 1;
      if (pPars->fVerbose != 0) {
        aVar3 = Abc_Clock();
        Zyx_ManPrint(p_00,fCompl,-1,clkTotal._4_4_,aVar3 - aVar2);
        p = (Zyx_Man_t *)Abc_Clock();
      }
      Zyx_ManPrintSolution(p_00,nSols,(uint)((uint)clkTotal == 1));
      iVar1 = Zyx_ManAddCnfBlockSolution(p_00);
      if (iVar1 == 0) goto LAB_0071523f;
    }
    else {
      if (pPars->fUseIncr == 0) {
        iVar1 = Zyx_ManAddCnfLazyFunc(p_00,nLazyAll);
      }
      else {
        iVar1 = Zyx_ManAddCnfLazyFunc2(p_00,nLazyAll);
      }
      if (iVar1 == 0) {
        printf("Became UNSAT after adding constraints for minterm %d\n",(ulong)(uint)nLazyAll);
LAB_0071523f:
        if (pPars->fVerbose != 0) {
          aVar3 = Abc_Clock();
          Zyx_ManPrint(p_00,fCompl,nLazyAll,clkTotal._4_4_,aVar3 - aVar2);
        }
        if (pPars->fEnumSols == 0) {
          if (nLazyAll == -1) {
            Zyx_ManPrintSolution(p_00,nSols,1);
          }
          else {
            printf("The problem has no solution.\n");
          }
        }
        else {
          printf("Finished enumerating %d solutions.\n",(ulong)(uint)clkTotal);
        }
        printf("Added = %d.  Tried = %d.  ",(ulong)(uint)p_00->nUsed[1],(ulong)(uint)p_00->nUsed[0])
        ;
        aVar3 = Abc_Clock();
        Abc_PrintTime(1,"Total runtime",aVar3 - aVar2);
        Zyx_ManFree(p_00);
        return;
      }
      iVar1 = bmcg_sat_solver_solve(p_00->pSat,(int *)0x0,0);
      if ((pPars->fVerbose != 0) && ((pPars->fUseIncr == 0 || (fCompl % 100 == 0)))) {
        aVar3 = Abc_Clock();
        Zyx_ManPrint(p_00,fCompl,nLazyAll,clkTotal._4_4_,aVar3 - (long)p);
        p = (Zyx_Man_t *)Abc_Clock();
      }
      if (iVar1 == -1) goto LAB_0071523f;
    }
    fCompl = fCompl + 1;
  } while( true );
}

Assistant:

void Zyx_ManExactSynthesis( Bmc_EsPar_t * pPars )
{
    int status, Iter, iMint = 0, fCompl = 0, nLazyAll = 0, nSols = 0;
    abctime clkTotal = Abc_Clock(), clk = Abc_Clock();  Zyx_Man_t * p; 
    word pTruth[16]; 
    if ( !pPars->fMajority )
    {
        Abc_TtReadHex( pTruth, pPars->pTtStr );
        if ( pTruth[0] & 1 ) { fCompl = 1; Abc_TtNot( pTruth, Abc_TtWordNum(pPars->nVars) ); }
    }
    assert( pPars->nVars <= 10 );
    assert( pPars->nLutSize <= 6 );
    p = Zyx_ManAlloc( pPars, pPars->fMajority ? NULL : pTruth );
    printf( "Running exact synthesis for %d-input function with %d %d-input %s...\n", 
        p->pPars->nVars, p->pPars->nNodes, p->pPars->nLutSize, p->pPars->fMajority ? "MAJ-gates" : "LUTs" );
    for ( Iter = 0 ; ; Iter++ )
    {
        while ( (status = bmcg_sat_solver_solve(p->pSat, NULL, 0)) == GLUCOSE_SAT )
        {
            int nLazy = Zyx_ManAddCnfLazyTopo( p );
            if ( nLazy == -1 )
            {
                printf( "Became UNSAT after adding lazy constraints.\n" );
                status = GLUCOSE_UNSAT;
                break;
            }
            //printf( "Added %d lazy constraints.\n\n", nLazy );
            if ( nLazy == 0 )
                break;
            nLazyAll += nLazy;
        }
        if ( status == GLUCOSE_UNSAT )
            break;
        // find mismatch
        iMint = Zyx_ManEval( p );
        if ( iMint == -1 )
        {
            if ( pPars->fEnumSols )
            {
                nSols++;
                if ( pPars->fVerbose )
                {
                    Zyx_ManPrint( p, Iter, iMint, nLazyAll, Abc_Clock() - clkTotal );
                    clk = Abc_Clock();
                }
                Zyx_ManPrintSolution( p, fCompl, nSols==1 );
                if ( !Zyx_ManAddCnfBlockSolution( p ) )
                {
                    status = GLUCOSE_UNSAT;
                    break;
                }
                continue;
            }
            else
                break;
        }
        if ( pPars->fUseIncr ? !Zyx_ManAddCnfLazyFunc2(p, iMint) : !Zyx_ManAddCnfLazyFunc(p, iMint) )
        {
            printf( "Became UNSAT after adding constraints for minterm %d\n", iMint );
            status = GLUCOSE_UNSAT;
            break;
        }
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( pPars->fVerbose && (!pPars->fUseIncr || Iter % 100 == 0) )
        {
            Zyx_ManPrint( p, Iter, iMint, nLazyAll, Abc_Clock() - clk );
            clk = Abc_Clock();
        }
        if ( status == GLUCOSE_UNSAT )
            break;
    }
    if ( pPars->fVerbose )
        Zyx_ManPrint( p, Iter, iMint, nLazyAll, Abc_Clock() - clkTotal );
    if ( pPars->fEnumSols )
        printf( "Finished enumerating %d solutions.\n", nSols );
    else if ( iMint == -1 )
        Zyx_ManPrintSolution( p, fCompl, 1 );
    else
        printf( "The problem has no solution.\n" );
    //Zyx_ManEvalStats( p );
    printf( "Added = %d.  Tried = %d.  ", p->nUsed[1], p->nUsed[0] );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    Zyx_ManFree( p );
}